

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::
CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test::TestBody
          (CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  _func_int **message_00;
  char *pcVar5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  shared_ptr<ot::commissioner::coap::Message> msg;
  ByteArray buffer;
  Error error;
  Message message;
  AssertHelper AStack_138;
  AssertHelper local_130;
  undefined8 *local_128;
  Error local_120;
  undefined1 local_f8 [16];
  ByteArray local_e8;
  Error local_c8;
  undefined1 local_a0 [64];
  pointer local_60;
  pointer local_58;
  _Alloc_hider local_48;
  char local_38 [32];
  
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_c8.mMessage.field_2;
  local_c8.mCode = kNone;
  local_c8.mMessage._M_string_length = 0;
  local_c8.mMessage.field_2._M_local_buf[0] = '\0';
  local_c8.mMessage._M_dataplus._M_p = (pointer)paVar1;
  Message::Message((Message *)local_a0,kConfirmable,kDelete);
  uVar2._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)&local_120 + 0x10);
  local_120._0_8_ = uVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"hello","");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_60,local_58,
             local_120._0_8_,local_120.mMessage._M_dataplus._M_p + local_120._0_8_);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_120._0_8_ !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )uVar2._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
    operator_delete((void *)local_120._0_8_);
  }
  Message::Serialize(&local_120,(Message *)local_a0,&local_e8);
  local_130.data_ = (AssertHelperData *)((ulong)local_130.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)local_f8,"message.Serialize(buffer)","ErrorCode::kNone",&local_120,
             (ErrorCode *)&local_130);
  if (local_120.mMessage._M_dataplus._M_p != (pointer)((long)&local_120 + 0x18U)) {
    operator_delete(local_120.mMessage._M_dataplus._M_p);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      message_00 = (_func_int **)(anon_var_dwarf_434f87 + 9);
    }
    else {
      message_00 = *(_func_int ***)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x129,(char *)message_00);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_120._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_120._0_8_ + 8))();
    }
  }
  uVar4 = local_f8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10)) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_f8._8_8_
                     );
    }
    operator_delete((void *)uVar4);
  }
  Message::Deserialize((Message *)local_f8,&local_c8,&local_e8);
  local_130.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)&local_120,"msg","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_f8,&local_130.data_);
  if ((string)(undefined1)local_120.mCode == (string)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_120.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar5 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar5 = *(char **)local_120.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x12d,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
  }
  _Var3._M_p = local_120.mMessage._M_dataplus._M_p;
  if (local_120.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_120.mMessage._M_dataplus._M_p != local_120.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_120.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_130.data_ = local_130.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_120,"error","ErrorCode::kNone",&local_c8,(ErrorCode *)&local_130);
  if ((string)(undefined1)local_120.mCode == (string)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_120.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar5 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar5 = *(char **)local_120.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x12e,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_130.data_ + 8))();
    }
  }
  if (local_120.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_120.mMessage._M_dataplus._M_p != local_120.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_120.mMessage._M_dataplus._M_p);
    }
    operator_delete(local_120.mMessage._M_dataplus._M_p);
  }
  local_120._0_8_ = uVar2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)&local_120,*(undefined8 *)(CONCAT71(local_f8._1_7_,local_f8[0]) + 0x40),
             *(undefined8 *)(CONCAT71(local_f8._1_7_,local_f8[0]) + 0x48));
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_130,"msg->GetPayloadAsString()","\"hello\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
             (char (*) [6])0x22064f);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_120._0_8_ !=
      (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )uVar2._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl) {
    operator_delete((void *)local_120._0_8_);
  }
  if (local_130.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_128 == (undefined8 *)0x0) {
      pcVar5 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar5 = (char *)*local_128;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x12f,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._0_8_ + 8))();
    }
  }
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(local_128);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree((_Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
               *)(local_a0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.mMessage._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_ValidVersion)
{
    ByteArray buffer{0x40, 0x00, 0x00, 0x00};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetVersion(), kVersion1);
    EXPECT_EQ(message->GetType(), Type::kConfirmable);
    EXPECT_EQ(message->GetToken().size(), 0);
    EXPECT_EQ(message->GetCode(), utils::from_underlying<Code>(0));
    EXPECT_EQ(message->GetMessageId(), 0);
}